

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O1

char * lex_token(LexerContext *lexer,char *begin,char *end,size_t begin_pos)

{
  char *begin_pos_00;
  char cVar1;
  byte bVar2;
  ulong length;
  unsigned_long uVar3;
  long lVar4;
  char *pcVar5;
  pair<const_char_*,_unsigned_long> *ppVar6;
  ulong uVar7;
  Token type;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  undefined1 local_48 [24];
  
  bVar12 = begin == end;
  if (bVar12) {
    return end;
  }
  lVar9 = 0;
  while (((ulong)(byte)begin[lVar9] < 0x2d &&
         ((0x130100002200U >> ((ulong)(byte)begin[lVar9] & 0x3f) & 1) != 0))) {
    lVar4 = lVar9 + 1;
    lVar9 = lVar9 + 1;
    bVar12 = begin + lVar4 == end;
    if (bVar12) {
      return end;
    }
  }
  if (bVar12) {
    return end;
  }
  pcVar5 = begin + lVar9;
  begin_pos_00 = (char *)(lVar9 + begin_pos);
  cVar1 = *pcVar5;
  if (cVar1 == '\"') {
    local_48[0] = true;
    pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (begin + lVar9 + 1,end);
    if (pcVar5 != end) {
      LexerContext::add_token
                (lexer,String,(size_t)begin_pos_00,(size_t)(pcVar5 + (-lVar9 - (long)begin) + 1));
      return pcVar5 + 1;
    }
    lexer->any_error = true;
    local_48._0_8_ = &lexer->stream;
    local_48._16_8_ = lVar9 + begin_pos + 1;
    local_48._8_8_ = begin_pos_00;
    ProgramContext::error<TokenStream::TokenInfo>
              (lexer->program,(TokenInfo *)local_48,"missing terminating \'\"\' character");
    return end;
  }
  if (9 < (byte)(cVar1 - 0x30U) && 1 < (byte)(cVar1 - 0x2dU)) goto LAB_00196512;
  lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_48,pcVar5,end);
  ppVar6 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value
                     ((optional<std::pair<const_char_*,_size_t>_> *)local_48);
  pcVar10 = ppVar6->first;
  length = ppVar6->second;
  if ((length < 3) || (*pcVar10 != '0')) {
    bVar12 = false;
  }
  else {
    bVar12 = (pcVar10[1] & 0xdfU) == 0x58;
  }
  bVar11 = length <= (uint)bVar12 * 2;
  if (!bVar11) {
    bVar11 = false;
    uVar7 = (ulong)((uint)bVar12 * 2);
    do {
      uVar8 = uVar7 + 1;
      bVar2 = pcVar10[uVar7];
      if (((byte)(bVar2 - 0x3a) < 0xf6) &&
         (((bVar12 == false || ((5 < (byte)(bVar2 + 0xbf) && (5 < bVar2 - 0x61)))) &&
          (bVar2 != 0x2d)))) break;
      bVar11 = length <= uVar8;
      uVar7 = uVar8;
    } while (uVar8 != length);
  }
  if (bVar11) {
    type = Integer;
    if (((2 < length) && ((lexer->program->opt).pedantic != false)) &&
       ((*pcVar10 == '0' && ((pcVar10[1] & 0xdfU) == 0x58)))) {
      local_48._0_8_ = &lexer->stream;
      local_48._16_8_ = begin_pos + length + lVar9;
      local_48._8_8_ = begin_pos_00;
      ProgramContext::pedantic<TokenStream::TokenInfo>
                (lexer->program,(TokenInfo *)local_48,
                 "hexadecimal integer literals are a language extension [-pedantic]");
      type = Integer;
    }
LAB_001964ed:
    LexerContext::add_token(lexer,type,(size_t)begin_pos_00,length);
    pcVar10 = pcVar10 + length;
    bVar12 = false;
  }
  else {
    bVar12 = length == 0;
    if (!bVar12) {
      bVar12 = false;
      uVar7 = 1;
      do {
        bVar2 = pcVar10[uVar7 - 1];
        if (((9 < (byte)(bVar2 - 0x30) && bVar2 != 0x2e) && (uVar7 != 1 || bVar2 != 0x2d)) &&
           ((bVar2 | 0x20) != 0x66)) break;
        bVar12 = length <= uVar7;
        bVar11 = uVar7 != length;
        uVar7 = uVar7 + 1;
      } while (bVar11);
    }
    type = Float;
    if (bVar12) goto LAB_001964ed;
    bVar12 = true;
  }
  if (!bVar12) {
    return pcVar10;
  }
LAB_00196512:
  lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_48,pcVar5,end);
  ppVar6 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value
                     ((optional<std::pair<const_char_*,_size_t>_> *)local_48);
  pcVar5 = ppVar6->first;
  uVar3 = ppVar6->second;
  LexerContext::add_token
            (lexer,Text,(size_t)begin_pos_00,(size_t)(pcVar5 + uVar3 + (-lVar9 - (long)begin)));
  return pcVar5 + uVar3;
}

Assistant:

static auto lex_token(LexerContext& lexer, const char* begin, const char* end, size_t begin_pos) -> const char*
{
    while(begin != end && lex_iswhite(*begin))
        ++begin, ++begin_pos;

    if(begin == end)
        return end;

    auto have_hexadecimal_prefix = [](const std::pair<const char*, size_t>& token)
    {
        return (token.second > 2 && token.first[0] == '0' && (token.first[1] == 'x' || token.first[1] == 'X'));
    };

    auto is_integer = [&have_hexadecimal_prefix](const std::pair<const char*, size_t>& token)
    {
        bool is_hexa = have_hexadecimal_prefix(token);

        for(size_t i = (is_hexa? 2 : 0); i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(is_hexa && ((token.first[i] >= 'A' && token.first[i] <= 'F')
                    || (token.first[i] >= 'a' && token.first[i] <= 'f')))
                {
                    continue;
                }
                else if(token.first[i] == '-')
                {
                    // valid even if i != 0
                    continue;
                }
                return false;
            }
        }
        return true;
    };

    auto is_float = [](const std::pair<const char*, size_t>& token)
    {
        for(size_t i = 0; i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(token.first[i] == '.' || (token.first[i] == '-' && i == 0))
                    continue;

                if(token.first[i] == 'f' || token.first[i] == 'F')
                {
                    // valid even if not in the end of the token
                    continue;
                }

                return false;
            }
        }
        return true;
    };

    if(*begin == '"')
    {
        auto it = std::find(std::next(begin), end, '"');
        if(it == end)
        {
            lexer.error(begin_pos, "missing terminating '\"' character");
            return end;
        }
        lexer.add_token(Token::String, begin_pos, std::distance(begin, it) + 1);
        return std::next(it);
    }

    if((*begin >= '0' && *begin <= '9') || *begin == '-' || *begin == '.')
    {
        auto token = lex_gettok(begin, end).value();

        if(is_integer(token))
        {
            if(lexer.program.opt.pedantic && have_hexadecimal_prefix(token))
                lexer.pedantic({begin_pos, token.second}, "hexadecimal integer literals are a language extension [-pedantic]");

            lexer.add_token(Token::Integer, begin_pos, token.second);
            return token.first + token.second;
        }
        else if(is_float(token))
        {
            lexer.add_token(Token::Float, begin_pos, token.second);
            return token.first + token.second;
        }
    }

    auto token = lex_gettok(begin, end).value();
    auto it = token.first + token.second;
    lexer.add_token(Token::Text, begin_pos, std::distance(begin, it));
    return it;
}